

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

void luaF_close(lua_State *L,StkId level)

{
  byte bVar1;
  int iVar2;
  global_State *pgVar3;
  TValue *pTVar4;
  GCObject *o;
  GCObject *uv;
  global_State *g;
  
  uv = L->openupval;
  if (uv != (GCObject *)0x0) {
    pgVar3 = L->l_G;
    do {
      if ((uv->h).metatable < level) {
        return;
      }
      L->openupval = (uv->gch).next;
      if ((~pgVar3->currentwhite & (uv->gch).marked & 3) == 0) {
        pTVar4 = (uv->h).array;
        ((uv->th).l_G)->ud = pTVar4;
        pTVar4[2].value = (Value)(uv->h).node;
        (uv->h).array = (TValue *)((uv->p).k)->value;
        iVar2 = ((uv->p).k)->tt;
        *(int *)&(uv->h).node = iVar2;
        (uv->h).metatable = (Table *)&(uv->h).array;
        g = L->l_G;
        (uv->gch).next = g->rootgc;
        g->rootgc = uv;
        bVar1 = (uv->gch).marked;
        if ((bVar1 & 7) == 0) {
          if (g->gcstate == '\x01') {
            (uv->gch).marked = bVar1 | 4;
            if ((3 < iVar2) && (o = (GCObject *)(uv->h).array, ((o->gch).marked & 3) != 0)) {
              g = L->l_G;
              if (g->gcstate != '\x01') goto LAB_00104577;
              reallymarkobject(g,o);
            }
          }
          else {
LAB_00104577:
            (uv->gch).marked = g->currentwhite & 3 | bVar1;
          }
        }
      }
      else {
        luaF_freeupval(L,&uv->uv);
      }
      uv = L->openupval;
    } while (uv != (GCObject *)0x0);
  }
  return;
}

Assistant:

static void luaF_close(lua_State*L,StkId level){
UpVal*uv;
global_State*g=G(L);
while(L->openupval!=NULL&&(uv=ngcotouv(L->openupval))->v>=level){
GCObject*o=obj2gco(uv);
L->openupval=uv->next;
if(isdead(g,o))
luaF_freeupval(L,uv);
else{
unlinkupval(uv);
setobj(L,&uv->u.value,uv->v);
uv->v=&uv->u.value;
luaC_linkupval(L,uv);
}
}
}